

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O0

void __thiscall Centaurus::Stage2Runner::reduce_bank(Stage2Runner *this,uint64_t *src)

{
  bool bVar1;
  tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
  *this_00;
  __tuple_element_t<0UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *starts_00;
  __tuple_element_t<1UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *ends_00;
  __tuple_element_t<2UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *values_00;
  __tuple_element_t<3UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *tags_00;
  CSTMarker local_50;
  CSTMarker marker;
  int i;
  __tuple_element_t<3UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *tags;
  __tuple_element_t<2UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *values;
  __tuple_element_t<1UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *ends;
  __tuple_element_t<0UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *starts;
  tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
  *ptr;
  uint64_t *src_local;
  Stage2Runner *this_local;
  
  this_00 = (tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
             *)operator_new(0x60);
  std::
  tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
  ::tuple<void,_true>(this_00);
  starts_00 = std::
              get<0ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                        (this_00);
  ends_00 = std::
            get<1ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                      (this_00);
  values_00 = std::
              get<2ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                        (this_00);
  tags_00 = std::
            get<3ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                      (this_00);
  for (marker.m_value._4_4_ = 0;
      ((ulong)(long)marker.m_value._4_4_ <
       (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_size >> 3 &&
      (src[marker.m_value._4_4_] != 0)); marker.m_value._4_4_ = marker.m_value._4_4_ + 1) {
    CSTMarker::CSTMarker(&local_50,src[marker.m_value._4_4_]);
    bVar1 = CSTMarker::is_start_marker(&local_50);
    if (bVar1) {
      NonRecursiveReductionRunner::push_start_marker(&local_50,starts_00,tags_00);
    }
    else {
      bVar1 = std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::empty
                        (starts_00);
      if (bVar1) {
        bVar1 = CSTMarker::is_end_marker(&local_50);
        if (!bVar1) {
          __assert_fail("marker.is_end_marker()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                        ,0x99,"void Centaurus::Stage2Runner::reduce_bank(uint64_t *)");
        }
        NonRecursiveReductionRunner::push_end_marker(&local_50,ends_00,tags_00);
      }
      else {
        bVar1 = CSTMarker::is_end_marker(&local_50);
        if (!bVar1) {
          __assert_fail("marker.is_end_marker()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                        ,0x9c,"void Centaurus::Stage2Runner::reduce_bank(uint64_t *)");
        }
        NonRecursiveReductionRunner::reduce_by_end_marker
                  (&this->super_NonRecursiveReductionRunner,&local_50,starts_00,values_00,tags_00);
      }
    }
  }
  *src = (uint64_t)this_00;
  return;
}

Assistant:

void reduce_bank(uint64_t *src)
  {
    auto ptr = new std::tuple<std::vector<CSTMarker>,
                              std::vector<CSTMarker>,
                              std::vector<semantic_value_type>,
                              std::vector<detail::StackEntryTag>>;
    auto& starts = std::get<0>(*ptr);
    auto& ends   = std::get<1>(*ptr);
    auto& values = std::get<2>(*ptr);
    auto& tags   = std::get<3>(*ptr);
#if PYCENTAURUS
    values.emplace_back(0);
#endif
    for (int i = 0; i < m_bank_size / 8; i++) {
      if (src[i] == 0) break;
      CSTMarker marker(src[i]);
      if (marker.is_start_marker()) {
        push_start_marker(marker, starts, tags);
      } else if (starts.empty()) {
        assert(marker.is_end_marker());
        push_end_marker(marker, ends, tags);
      } else {
        assert(marker.is_end_marker());
        reduce_by_end_marker(marker, starts, values, tags);
      }
    }
#if PYCENTAURUS
    auto it = src;
    *it++ = starts.size();
    std::memcpy(it, starts.data(), starts.size()*sizeof(CSTMarker));
    it += starts.size();
    *it++ = ends.size();
    std::memcpy(it, ends.data(), ends.size()*sizeof(CSTMarker));
    it += ends.size();
    *it++ = values.size();
    std::memcpy(it, values.data(), values.size()*sizeof(semantic_value_type));
    it += values.size();
    *it++ = tags.size();
    std::memcpy(it, tags.data(), tags.size()*sizeof(detail::StackEntryTag));
    assert(reinterpret_cast<uint64_t*>(reinterpret_cast<detail::StackEntryTag*>(it) + tags.size()) < src + m_bank_size / 8);
#else
    *src = reinterpret_cast<uint64_t>(ptr);
#endif
  }